

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::Model::set_allocated_scaler(Model *this,Scaler *scaler)

{
  ulong uVar1;
  Arena *submessage_arena;
  Arena *message_arena;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  message_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    message_arena = *(Arena **)message_arena;
  }
  clear_Type(this);
  if (scaler != (Scaler *)0x0) {
    submessage_arena =
         google::protobuf::internal::InternalMetadata::owning_arena
                   (&(scaler->super_MessageLite)._internal_metadata_);
    if (message_arena != submessage_arena) {
      scaler = (Scaler *)
               google::protobuf::internal::GetOwnedMessageInternal
                         (message_arena,&scaler->super_MessageLite,submessage_arena);
    }
    this->_oneof_case_[0] = 0x25c;
    (this->Type_).scaler_ = scaler;
  }
  return;
}

Assistant:

void Model::set_allocated_scaler(::CoreML::Specification::Scaler* scaler) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_Type();
  if (scaler) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
        ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<
            ::PROTOBUF_NAMESPACE_ID::MessageLite>::GetOwningArena(
                reinterpret_cast<::PROTOBUF_NAMESPACE_ID::MessageLite*>(scaler));
    if (message_arena != submessage_arena) {
      scaler = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, scaler, submessage_arena);
    }
    set_has_scaler();
    Type_.scaler_ = scaler;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.Model.scaler)
}